

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O3

VmConstant *
LoadFrameValue(InstructionVMEvalContext *ctx,VmConstant *pointer,VmConstant *offset,VmType type,
              uint loadSize)

{
  FunctionData *pFVar1;
  SynIdentifier *pSVar2;
  Storage *storage;
  VmConstant *pVVar3;
  ulong uVar4;
  uint uVar5;
  char *pcVar6;
  VmValueType VVar7;
  int iVar8;
  uint uVar9;
  VmValueType VVar10;
  uint uVar11;
  ulong uVar12;
  VmType type_00;
  VmType type_01;
  VmType type_02;
  uint base;
  uint local_4c;
  TypeBase *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar4 = type._0_8_;
  local_4c = 0;
  storage = FindTarget(ctx,pointer,&local_4c);
  uVar5 = local_4c;
  if (storage == (Storage *)0x0) {
    if (ctx->hasError == false) {
      __assert_fail("ctx.hasError",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                    ,0x23f,
                    "VmConstant *LoadFrameValue(InstructionVMEvalContext &, VmConstant *, VmConstant *, VmType, unsigned int)"
                   );
    }
    return (VmConstant *)0x0;
  }
  uVar12 = uVar4 >> 0x20;
  local_48 = type.structType;
  if (ctx->printExecution != false) {
    pcVar6 = "---";
    iVar8 = 0x208ecd;
    if ((storage->functionOwner != (VmFunction *)0x0) &&
       (pFVar1 = storage->functionOwner->function, pFVar1 != (FunctionData *)0x0)) {
      pSVar2 = pFVar1->name;
      pcVar6 = (pSVar2->name).begin;
      iVar8 = (int)(pSVar2->name).end;
    }
    local_40 = uVar12;
    local_38 = uVar4;
    printf("      LoadFrameValue %.*s [%s] @ %04x + %02x [%02x]\n",
           (ulong)(uint)(iVar8 - (int)pcVar6),pcVar6,storage->tag,(ulong)local_4c,
           (ulong)(ushort)pointer->iValue,loadSize);
    uVar4 = local_38;
    uVar12 = local_40;
  }
  uVar5 = (ushort)pointer->iValue + uVar5;
  if (offset != (VmConstant *)0x0) {
    uVar5 = uVar5 + offset->iValue;
  }
  VVar7 = (VmValueType)uVar4;
  VVar10 = VVar7 ^ VM_TYPE_INT;
  uVar11 = (uint)uVar12;
  uVar9 = uVar11 ^ 4;
  if (loadSize == 1 && (uVar9 == 0 && VVar10 == VM_TYPE_VOID)) {
    pVVar3 = LoadFrameByte(ctx,storage,uVar5);
    return pVVar3;
  }
  if ((uVar9 == 0 && VVar10 == VM_TYPE_VOID) && loadSize == 2) {
    pVVar3 = LoadFrameShort(ctx,storage,uVar5);
    return pVVar3;
  }
  if ((loadSize == 4) && (VVar7 == VM_TYPE_POINTER || uVar9 == 0 && VVar10 == VM_TYPE_VOID)) {
    type_00.structType = local_48;
    type_00.type = (int)uVar4;
    type_00.size = (int)(uVar4 >> 0x20);
    pVVar3 = LoadFrameInt(ctx,storage,uVar5,type_00);
    return pVVar3;
  }
  if (((uVar11 ^ 8) == 0 && (VVar7 ^ VM_TYPE_DOUBLE) == VM_TYPE_VOID) && loadSize == 4) {
    pVVar3 = LoadFrameFloat(ctx,storage,uVar5);
    return pVVar3;
  }
  if (((uVar11 ^ 8) != 0 || (VVar7 ^ VM_TYPE_DOUBLE) != VM_TYPE_VOID) || loadSize != 8) {
    if ((loadSize == 8) && (VVar7 == VM_TYPE_POINTER || uVar11 == 8 && VVar7 == VM_TYPE_LONG)) {
      type_01.structType = local_48;
      type_01.type = (int)uVar4;
      type_01.size = (int)(uVar4 >> 0x20);
      pVVar3 = LoadFrameLong(ctx,storage,uVar5,type_01);
      return pVVar3;
    }
    type_02.structType = local_48;
    type_02.type = (int)uVar4;
    type_02.size = (int)(uVar4 >> 0x20);
    pVVar3 = LoadFrameStruct(ctx,storage,uVar5,type_02);
    return pVVar3;
  }
  pVVar3 = LoadFrameDouble(ctx,storage,uVar5);
  return pVVar3;
}

Assistant:

VmConstant* LoadFrameValue(InstructionVMEvalContext &ctx, VmConstant *pointer, VmConstant *offset, VmType type, unsigned loadSize)
{
	unsigned base = 0;

	if(InstructionVMEvalContext::Storage *target = FindTarget(ctx, pointer, base))
	{
		if(ctx.printExecution)
		{
			InplaceStr functionName = target->functionOwner && target->functionOwner->function? target->functionOwner->function->name->name : InplaceStr("---");

			printf("      LoadFrameValue %.*s [%s] @ %04x + %02x [%02x]\n", FMT_ISTR(functionName), target->tag, base, pointer->iValue & memoryOffsetMask, loadSize);
		}

		unsigned location = (pointer->iValue & memoryOffsetMask) + base;

		if(offset)
			location += offset->iValue;

		if(type == VmType::Int && loadSize == 1)
			return LoadFrameByte(ctx, target, location);

		if(type == VmType::Int && loadSize == 2)
			return LoadFrameShort(ctx, target, location);

		if((type == VmType::Int || type.type == VM_TYPE_POINTER) && loadSize == 4)
			return LoadFrameInt(ctx, target, location, type);

		if(type == VmType::Double && loadSize == 4)
			return LoadFrameFloat(ctx, target, location);

		if(type == VmType::Double && loadSize == 8)
			return LoadFrameDouble(ctx, target, location);

		if((type == VmType::Long || type.type == VM_TYPE_POINTER) && loadSize == 8)
			return LoadFrameLong(ctx, target, location, type);

		return LoadFrameStruct(ctx, target, location, type);
	}

	assert(ctx.hasError);

	return NULL;
}